

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O0

uint16_t mbedtls_ssl_read_version(uchar *version,int transport)

{
  uint16_t uVar1;
  short sVar2;
  undefined2 local_16;
  uint16_t tls_version;
  int transport_local;
  uchar *version_local;
  
  uVar1 = mbedtls_get_unaligned_uint16(version);
  local_16 = uVar1 << 8 | uVar1 >> 8;
  if (transport == 1) {
    sVar2 = 0x201;
    if (local_16 == 0xfeff) {
      sVar2 = 0x202;
    }
    local_16 = local_16 - sVar2 ^ 0xffff;
  }
  return local_16;
}

Assistant:

uint16_t mbedtls_ssl_read_version(const unsigned char version[2],
                                  int transport)
{
    uint16_t tls_version = MBEDTLS_GET_UINT16_BE(version, 0);
#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if (transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM) {
        tls_version =
            ~(tls_version - (tls_version == 0xfeff ? 0x0202 : 0x0201));
    }
#else
    ((void) transport);
#endif
    return tls_version;
}